

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunction.h
# Opt level: O3

void __thiscall bwtil::HashFunction::quickSort(HashFunction *this,ulint *arr,uint n)

{
  ulong uVar1;
  ulint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (n < 2) {
    return;
  }
LAB_0010d9a0:
  uVar3 = rand();
  uVar1 = arr[(ulong)uVar3 % (ulong)n];
  uVar5 = (ulong)n;
  uVar6 = 0;
LAB_0010d9bc:
  if (arr[uVar6] < uVar1) goto code_r0x0010d9c2;
  if ((uint)uVar6 < n) {
    uVar7 = uVar6 & 0xffffffff;
    do {
      uVar6 = uVar6 & 0xffffffff;
      do {
        if (arr[uVar6] < uVar1) {
          uVar2 = arr[uVar7];
          arr[uVar7] = arr[uVar6];
          arr[uVar6] = uVar2;
          uVar7 = (ulong)((int)uVar7 + 1);
          break;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar5);
    } while ((uint)uVar6 < n);
  }
  else {
    uVar7 = uVar6 & 0xffffffff;
  }
  if ((int)uVar7 == 0) {
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 + 1;
    } while (arr[uVar4] != uVar1);
    uVar2 = *arr;
    uVar7 = 1;
    *arr = uVar1;
    arr[uVar4] = uVar2;
  }
  goto LAB_0010da20;
code_r0x0010d9c2:
  uVar6 = uVar6 + 1;
  if (uVar5 + (uVar5 == 0) == uVar6) goto code_r0x0010d9ca;
  goto LAB_0010d9bc;
code_r0x0010d9ca:
  uVar7 = (ulong)n;
LAB_0010da20:
  quickSort(this,arr,(uint)uVar7);
  arr = arr + uVar7;
  n = n - (uint)uVar7;
  if (n < 2) {
    return;
  }
  goto LAB_0010d9a0;
}

Assistant:

void quickSort(ulint *arr, uint n) {

		if(n<2) return;

		ulint pivot = arr[rand()%(n)];
		ulint t;
		uint i=0,j=0;

		while(i<n && arr[i]<pivot)
			i++;

		j=i;

		//invariant: arr[0,...,i-1]<pivot; arr[i,...,j]>=pivot
		while (j<n) {

			while(j<n && (arr[j]>=pivot))
				j++;

			if(j<n){//swap arr[i] and arr[j]
				t = arr[i];
				arr[i] = arr[j];
				arr[j] = t;
				i++;
			}

		}

		if(i==0){//pivot is the minimum element: avoid loop

			j=0;
			while(arr[j]!=pivot)
				j++;

			t = arr[i];
			arr[i] = arr[j];
			arr[j] = t;

			i++;
		}

		quickSort(arr,i);
		quickSort(arr+i,n-i);

	}